

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O2

int HorseTrap(Situation *s)

{
  int to;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  int horse_traps_value [2];
  
  lVar4 = 0;
  do {
    if (lVar4 == 2) {
      iVar6 = -(horse_traps_value[1] - horse_traps_value[0]);
      if (s->current_player == 0) {
        iVar6 = horse_traps_value[1] - horse_traps_value[0];
      }
      return iVar6;
    }
    horse_traps_value[lVar4] = 0;
    iVar6 = 0;
    for (uVar5 = 5; uVar5 != 7; uVar5 = uVar5 + 1) {
      if ((ulong)s->current_pieces[uVar5 | lVar4 * 0x10 + 0x10U] != 0) {
        lVar8 = (ulong)s->current_pieces[uVar5 | lVar4 * 0x10 + 0x10U] * 0x28;
        bVar1 = false;
        while( true ) {
          to = *(int *)((long)HORSE_CAN_GET[0] + lVar8);
          lVar7 = (long)to;
          if (lVar7 == 0) break;
          bVar2 = bVar1;
          if ((((EDGE_SQUARES[lVar7] == false) && (s->current_board[lVar7] == '\0')) &&
              (s->current_board[*(int *)((long)HORSE_LEG[0] + lVar8)] == '\0')) &&
             ((bVar3 = IfProtected(1 - (int)lVar4,to,s,0), !bVar3 && (bVar2 = true, bVar1))))
          goto LAB_0010cc00;
          bVar1 = bVar2;
          lVar8 = lVar8 + 4;
        }
        iVar6 = iVar6 + (uint)!bVar1 * 5 + 5;
        horse_traps_value[lVar4] = iVar6;
      }
LAB_0010cc00:
    }
    lVar4 = lVar4 + 1;
  } while( true );
}

Assistant:

int HorseTrap(Situation &s)
{
    int side_tag;
    int moveble;
    int horse_traps_value[2];
    int *horse_dst, *horse_leg;
    int dst;
    for (int r = 0; r < 2; r++)
    {
        side_tag = 16 + (r << 4);
        horse_traps_value[r] = 0;
        // 考虑马可以走的位置，走到棋盘边缘上，或者走到对方的控制格，都必须排除
        for (int i = 5; i <= 6; i++)
        {
            int pos = s.current_pieces[side_tag + i];
            if (pos != 0)
            {
                moveble = 0;
                horse_dst = HORSE_CAN_GET[pos];
                horse_leg = HORSE_LEG[pos];
                dst = *horse_dst;
                while (dst)
                {
                    if (!EDGE_SQUARES[dst] && !s.current_board[dst] && !s.current_board[*horse_leg] && !IfProtected(1 - r, dst, s))
                    {
                        moveble++;
                        if (moveble > 1)
                            break;
                    }
                    horse_dst++;
                    dst = *horse_dst;
                    horse_leg++;
                }
                // 没有好的着法的马给予10分罚分，只有一个好的着法的马给予5分罚分
                if (!moveble)
                    horse_traps_value[r] += 10;
                else if (moveble == 1)
                    horse_traps_value[r] += 5;
            }
        }
    }
    return SideValue(s.current_player, horse_traps_value[1] - horse_traps_value[0]);
}